

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O2

void __thiscall olc::PixelGameEngine::SetLayerScale(PixelGameEngine *this,uint8_t layer,vf2d *scale)

{
  pointer pLVar1;
  undefined7 in_register_00000031;
  ulong uVar2;
  
  uVar2 = CONCAT71(in_register_00000031,layer) & 0xffffffff;
  pLVar1 = (this->vLayers).super__Vector_base<olc::LayerDesc,_std::allocator<olc::LayerDesc>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (uVar2 < (ulong)(((long)(this->vLayers).
                             super__Vector_base<olc::LayerDesc,_std::allocator<olc::LayerDesc>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)pLVar1) / 0x68)) {
    pLVar1[uVar2].vScale = *scale;
  }
  return;
}

Assistant:

void PixelGameEngine::SetLayerScale(uint8_t layer, const olc::vf2d& scale)
	{ SetLayerScale(layer, scale.x, scale.y); }